

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O3

void __thiscall libtorrent::aux::tracker_list::set_complete_sent(tracker_list *this)

{
  byte *pbVar1;
  node_ptr plVar2;
  announce_entry *t;
  node_ptr plVar3;
  node_ptr plVar4;
  long lVar5;
  
  for (plVar3 = (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.next_;
      plVar3 != &(this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node;
      plVar3 = plVar3->next_) {
    plVar2 = plVar3[5].prev_;
    for (plVar4 = plVar3[5].next_; plVar4 != plVar2; plVar4 = (node_ptr)&plVar4[0xc].prev_) {
      lVar5 = 100;
      do {
        pbVar1 = (byte *)((long)&plVar4->next_ + lVar5 + 1);
        *pbVar1 = *pbVar1 | 2;
        lVar5 = lVar5 + 0x48;
      } while (lVar5 != 0xf4);
    }
  }
  return;
}

Assistant:

void tracker_list::set_complete_sent()
{
	INVARIANT_CHECK;
	for (auto& t : m_trackers)
	{
		for (auto& aep : t.endpoints)
		{
			for (auto& a : aep.info_hashes)
				a.complete_sent = true;
		}
	}
}